

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O0

bool sc_dt::operator==(sc_signed *u,sc_unsigned *v)

{
  int iVar1;
  undefined8 in_RSI;
  sc_digit *in_RDI;
  small_type unaff_retaddr;
  int in_stack_00000010;
  sc_digit *in_stack_00000018;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  bool bVar2;
  
  if (in_RDI[2] == 0xffffffff) {
    bVar2 = false;
  }
  else {
    iVar1 = compare_unsigned(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,
                             in_RDI,(small_type)((ulong)in_RSI >> 0x20),(int)in_RSI,
                             in_stack_00000010,in_stack_00000018,(small_type)v,(small_type)u);
    if (iVar1 == 0) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool
operator==(const sc_signed& u, const sc_unsigned& v)
{
  if (u.sgn == SC_NEG)
    return false;
  if (compare_unsigned(u.sgn, u.nbits, u.ndigits, u.digit,
                       v.sgn, v.nbits, v.ndigits, v.digit, 1, 0) != 0)
    return false;
  return true;
}